

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
CConnman::GetNodeStats(CConnman *this,vector<CNodeStats,_std::allocator<CNodeStats>_> *vstats)

{
  pointer ppCVar1;
  CNode *this_00;
  uint32_t uVar2;
  pointer ppCVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock91;
  unique_lock<std::recursive_mutex> uStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CNodeStats,_std::allocator<CNodeStats>_>::clear(vstats);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_48,&this->m_nodes_mutex,
             "m_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xe06,false);
  std::vector<CNodeStats,_std::allocator<CNodeStats>_>::reserve
            (vstats,(long)(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar3 != ppCVar1; ppCVar3 = ppCVar3 + 1) {
    this_00 = *ppCVar3;
    std::vector<CNodeStats,_std::allocator<CNodeStats>_>::emplace_back<>(vstats);
    CNode::CopyStats(this_00,(vstats->super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>).
                             _M_impl.super__Vector_impl_data._M_finish + -1);
    uVar2 = GetMappedAS(this,(CNetAddr *)&this_00->addr);
    (vstats->super__Vector_base<CNodeStats,_std::allocator<CNodeStats>_>)._M_impl.
    super__Vector_impl_data._M_finish[-1].m_mapped_as = uVar2;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::GetNodeStats(std::vector<CNodeStats>& vstats) const
{
    vstats.clear();
    LOCK(m_nodes_mutex);
    vstats.reserve(m_nodes.size());
    for (CNode* pnode : m_nodes) {
        vstats.emplace_back();
        pnode->CopyStats(vstats.back());
        vstats.back().m_mapped_as = GetMappedAS(pnode->addr);
    }
}